

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize.h
# Opt level: O2

void SerializeMany<DataStream,std::vector<unsigned_char,std::allocator<unsigned_char>>,unsigned_int,unsigned_int,unsigned_char>
               (DataStream *s,vector<unsigned_char,_std::allocator<unsigned_char>_> *args,
               uint *args_1,uint *args_2,uchar *args_3)

{
  long lVar1;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  Serialize<DataStream,unsigned_char,std::allocator<unsigned_char>>(s,args);
  ser_writedata32<DataStream>(s,*args_1);
  ser_writedata32<DataStream>(s,*args_2);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    ser_writedata8<DataStream>(s,*args_3);
    return;
  }
  __stack_chk_fail();
}

Assistant:

void SerializeMany(Stream& s, const Args&... args)
{
    (::Serialize(s, args), ...);
}